

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O2

string * __thiscall
wallet::TxStateConfirmed::toString_abi_cxx11_(string *__return_storage_ptr__,TxStateConfirmed *this)

{
  int *in_R9;
  long in_FS_OFFSET;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  base_blob<256u>::ToString_abi_cxx11_(&local_40,(base_blob<256u> *)this);
  tinyformat::format<std::__cxx11::string,int,int>
            (__return_storage_ptr__,(tinyformat *)"Confirmed (block=%s, height=%i, index=%i)",
             (char *)&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->confirmed_block_height,&this->position_in_block,in_R9);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string toString() const { return strprintf("Confirmed (block=%s, height=%i, index=%i)", confirmed_block_hash.ToString(), confirmed_block_height, position_in_block); }